

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 uVar2;
  long *plVar3;
  long *time_00;
  undefined8 uVar4;
  CVadjCheckPointRec *ckpnt;
  int ncheck;
  int retval;
  sunrealtype time;
  N_Vector qB;
  N_Vector yB;
  sunrealtype abstolQB;
  sunrealtype abstolB;
  sunrealtype reltolB;
  int indexB;
  int steps;
  N_Vector q;
  N_Vector y;
  sunrealtype abstolQ;
  sunrealtype reltolQ;
  FILE *FID;
  void *cvode_mem;
  SUNLinearSolver LSB;
  SUNLinearSolver LS;
  SUNMatrix AB;
  SUNMatrix A;
  UserData data;
  SUNContext sunctx;
  N_Vector yB_00;
  uint in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  N_Vector in_stack_ffffffffffffff58;
  undefined4 local_78;
  undefined4 local_74;
  long *local_70;
  long *local_68;
  undefined8 local_60;
  undefined8 local_58;
  FILE *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18 [2];
  int local_4;
  
  local_4 = 0;
  local_20 = (undefined8 *)0x0;
  local_30 = 0;
  local_28 = 0;
  local_40 = 0;
  local_38 = 0;
  local_48 = 0;
  yB_00 = (N_Vector)0x0;
  local_68 = (long *)0x0;
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("-------------------------------------------------\n\n");
  printf("ODE: dy1/dt = -p1*y1 + p2*y2*y3\n");
  printf("     dy2/dt =  p1*y1 - p2*y2*y3 - p3*(y2)^2\n");
  printf("     dy3/dt =  p3*(y2)^2\n\n");
  printf("Find dG/dp for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");
  local_20 = (undefined8 *)malloc(0x18);
  iVar1 = check_retval(in_stack_ffffffffffffff58,
                       (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (int)((ulong)yB_00 >> 0x20));
  if (iVar1 == 0) {
    *local_20 = 0x3fa47ae147ae147b;
    local_20[1] = 0x40c3880000000000;
    local_20[2] = 0x417c9c3800000000;
    uVar2 = SUNContext_Create(0,local_18);
    iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff50)
                         ,(int)((ulong)yB_00 >> 0x20));
    if (iVar1 == 0) {
      local_68 = (long *)N_VNew_Serial(3,local_18[0]);
      iVar1 = check_retval(in_stack_ffffffffffffff58,
                           (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                           (int)((ulong)yB_00 >> 0x20));
      if (iVar1 == 0) {
        **(undefined8 **)(*local_68 + 0x10) = 0x3ff0000000000000;
        *(undefined8 *)(*(long *)(*local_68 + 0x10) + 8) = 0;
        *(undefined8 *)(*(long *)(*local_68 + 0x10) + 0x10) = 0;
        local_70 = (long *)N_VNew_Serial(1,local_18[0]);
        iVar1 = check_retval(in_stack_ffffffffffffff58,
                             (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                             (int)((ulong)yB_00 >> 0x20));
        if (iVar1 == 0) {
          **(undefined8 **)(*local_70 + 0x10) = 0;
          local_58 = 0x3eb0c6f7a0b5ed8d;
          local_60 = 0x3eb0c6f7a0b5ed8d;
          printf("Create and allocate CVODES memory for forward runs\n");
          local_48 = CVodeCreate(2,local_18[0]);
          iVar1 = check_retval(in_stack_ffffffffffffff58,
                               (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                               (int)((ulong)yB_00 >> 0x20));
          if (iVar1 == 0) {
            uVar2 = CVodeInit(0,local_48,f,local_68);
            iVar1 = check_retval(in_stack_ffffffffffffff58,
                                 (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                 (int)((ulong)yB_00 >> 0x20));
            if (iVar1 == 0) {
              uVar2 = CVodeWFtolerances(local_48,ewt);
              iVar1 = check_retval(in_stack_ffffffffffffff58,
                                   (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                   (int)((ulong)yB_00 >> 0x20));
              if (iVar1 == 0) {
                uVar2 = CVodeSetUserData(local_48,local_20);
                iVar1 = check_retval(in_stack_ffffffffffffff58,
                                     (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                     (int)((ulong)yB_00 >> 0x20));
                if (iVar1 == 0) {
                  local_28 = SUNDenseMatrix(3,3,local_18[0]);
                  iVar1 = check_retval(in_stack_ffffffffffffff58,
                                       (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                       (int)((ulong)yB_00 >> 0x20));
                  if (iVar1 == 0) {
                    local_38 = SUNLinSol_Dense(local_68,local_28,local_18[0]);
                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                         (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                         (int)((ulong)yB_00 >> 0x20));
                    if (iVar1 == 0) {
                      uVar2 = CVodeSetLinearSolver(local_48,local_38,local_28);
                      iVar1 = check_retval(in_stack_ffffffffffffff58,
                                           (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                           (int)((ulong)yB_00 >> 0x20));
                      if (iVar1 == 0) {
                        uVar2 = CVodeSetJacFn(local_48,Jac);
                        iVar1 = check_retval(in_stack_ffffffffffffff58,
                                             (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                             (int)((ulong)yB_00 >> 0x20));
                        if (iVar1 == 0) {
                          uVar2 = CVodeQuadInit(local_48,fQ,local_70);
                          iVar1 = check_retval(in_stack_ffffffffffffff58,
                                               (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                               (int)((ulong)yB_00 >> 0x20));
                          if (iVar1 == 0) {
                            uVar2 = CVodeSetQuadErrCon(local_48,1);
                            iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                 (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                                                 (int)((ulong)yB_00 >> 0x20));
                            if (iVar1 == 0) {
                              uVar2 = CVodeQuadSStolerances(local_58,local_60,local_48);
                              iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                   (char *)CONCAT44(uVar2,in_stack_ffffffffffffff50)
                                                   ,(int)((ulong)yB_00 >> 0x20));
                              if (iVar1 == 0) {
                                uVar2 = CVodeSetMaxNumSteps(local_48,0x9c4);
                                iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                     (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                if (iVar1 == 0) {
                                  local_74 = 0x96;
                                  uVar2 = CVodeAdjInit(local_48,0x96,1);
                                  iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                       (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                  if (iVar1 == 0) {
                                    printf("Forward integration ... ");
                                    uVar2 = CVodeF(0x418312d000000000,local_48,local_68,
                                                   &stack0xffffffffffffff58,1,
                                                   &stack0xffffffffffffff50);
                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                    if (iVar1 == 0) {
                                      printf("done (ncheck = %d)\n",(ulong)in_stack_ffffffffffffff50
                                            );
                                      uVar2 = CVodeGetQuad(local_48,&stack0xffffffffffffff58,
                                                           local_70);
                                      iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                           (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                      if (iVar1 == 0) {
                                        printf(
                                              "--------------------------------------------------------\n"
                                              );
                                        printf("G:          %12.4e \n",
                                               **(undefined8 **)(*local_70 + 0x10));
                                        printf(
                                              "--------------------------------------------------------\n"
                                              );
                                        printf("\nFinal Statistics:\n");
                                        CVodePrintAllStats(local_48,_stdout,0);
                                        local_50 = fopen("cvsRoberts_ASAi_dns_fwd_stats.csv","w");
                                        uVar2 = CVodePrintAllStats(local_48,local_50,1);
                                        fclose(local_50);
                                        plVar3 = (long *)N_VNew_Serial(3,local_18[0]);
                                        iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                             (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                        if (iVar1 == 0) {
                                          **(undefined8 **)(*plVar3 + 0x10) = 0;
                                          *(undefined8 *)(*(long *)(*plVar3 + 0x10) + 8) = 0;
                                          *(undefined8 *)(*(long *)(*plVar3 + 0x10) + 0x10) = 0;
                                          time_00 = (long *)N_VNew_Serial(3,local_18[0]);
                                          iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                               (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                          if (iVar1 == 0) {
                                            **(undefined8 **)(*time_00 + 0x10) = 0;
                                            *(undefined8 *)(*(long *)(*time_00 + 0x10) + 8) = 0;
                                            *(undefined8 *)(*(long *)(*time_00 + 0x10) + 0x10) = 0;
                                            printf(
                                                  "\nCreate and allocate CVODES memory for backward run\n"
                                                  );
                                            uVar2 = CVodeCreateB(local_48,2,&local_78);
                                            iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                 (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                            if (iVar1 == 0) {
                                              uVar2 = CVodeInitB(0x418312d000000000,local_48,
                                                                 local_78,fB,plVar3);
                                              iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                   (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                              if (iVar1 == 0) {
                                                uVar2 = CVodeSStolerancesB(0x3eb0c6f7a0b5ed8d,
                                                                           0x3e45798ee2308c3a,
                                                                           local_48,local_78);
                                                iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                     (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                if (iVar1 == 0) {
                                                  uVar2 = CVodeSetUserDataB(local_48,local_78,
                                                                            local_20);
                                                  iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                       (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    local_30 = SUNDenseMatrix(3,3,local_18[0]);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    local_40 = SUNLinSol_Dense(plVar3,local_30,
                                                                               local_18[0]);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeSetLinearSolverB
                                                                      (local_48,local_78,local_40,
                                                                       local_30);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeSetJacFnB(local_48,local_78,JacB);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeQuadInitB(local_48,local_78,fQB,
                                                                           time_00);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeSetQuadErrConB(local_48,local_78,1)
                                                    ;
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeQuadSStolerancesB
                                                                      (0x3eb0c6f7a0b5ed8d,
                                                                       0x3eb0c6f7a0b5ed8d,local_48,
                                                                       local_78);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    PrintHead(5.24106813370978e-318);
                                                    uVar2 = CVodeB(0x4044000000000000,local_48,1);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetB(local_48,local_78,
                                                                      &stack0xffffffffffffff58,
                                                                      plVar3);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetAdjY(0x4044000000000000,local_48
                                                                         ,local_68);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    PrintOutput1((sunrealtype)time_00,
                                                                 (sunrealtype)
                                                                 in_stack_ffffffffffffff58,
                                                                 (N_Vector)
                                                                 CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),yB_00);
                                                  uVar2 = CVodeB(0,local_48,1);
                                                  iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                       (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetB(local_48,local_78,
                                                                      &stack0xffffffffffffff58,
                                                                      plVar3);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetQuadB(local_48,local_78,
                                                                          &stack0xffffffffffffff58,
                                                                          time_00);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetAdjY(0,local_48,local_68);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    PrintOutput((sunrealtype)time_00,
                                                                in_stack_ffffffffffffff58,
                                                                (N_Vector)
                                                                CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),yB_00);
                                                  printf("\nFinal Statistics:\n");
                                                  uVar4 = CVodeGetAdjCVodeBmem(local_48,local_78);
                                                  CVodePrintAllStats(uVar4,_stdout,0);
                                                  local_50 = fopen(
                                                  "cvsRoberts_ASAi_dns_bkw1_stats.csv","w");
                                                  uVar4 = CVodeGetAdjCVodeBmem(local_48,local_78);
                                                  CVodePrintAllStats(uVar4,local_50,1);
                                                  fclose(local_50);
                                                  **(undefined8 **)(*plVar3 + 0x10) = 0;
                                                  *(undefined8 *)(*(long *)(*plVar3 + 0x10) + 8) = 0
                                                  ;
                                                  *(undefined8 *)(*(long *)(*plVar3 + 0x10) + 0x10)
                                                       = 0;
                                                  **(undefined8 **)(*time_00 + 0x10) = 0;
                                                  *(undefined8 *)(*(long *)(*time_00 + 0x10) + 8) =
                                                       0;
                                                  *(undefined8 *)(*(long *)(*time_00 + 0x10) + 0x10)
                                                       = 0;
                                                  printf(
                                                  "\nRe-initialize CVODES memory for backward run\n"
                                                  );
                                                  uVar2 = CVodeReInitB(0x4049000000000000,local_48,
                                                                       local_78,plVar3);
                                                  iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                       (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeQuadReInitB(local_48,local_78,
                                                                             time_00);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    PrintHead(5.24573705406298e-318);
                                                    uVar2 = CVodeB(0x4044000000000000,local_48,1);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetB(local_48,local_78,
                                                                      &stack0xffffffffffffff58,
                                                                      plVar3);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetAdjY(0x4044000000000000,local_48
                                                                         ,local_68);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    PrintOutput1((sunrealtype)time_00,
                                                                 (sunrealtype)
                                                                 in_stack_ffffffffffffff58,
                                                                 (N_Vector)
                                                                 CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),yB_00);
                                                  uVar2 = CVodeB(0,local_48,1);
                                                  iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                       (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetB(local_48,local_78,
                                                                      &stack0xffffffffffffff58,
                                                                      plVar3);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetQuadB(local_48,local_78,
                                                                          &stack0xffffffffffffff58,
                                                                          time_00);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    uVar2 = CVodeGetAdjY(0,local_48,local_68);
                                                    iVar1 = check_retval(in_stack_ffffffffffffff58,
                                                                         (char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),
                                                  (int)((ulong)yB_00 >> 0x20));
                                                  if (iVar1 == 0) {
                                                    PrintOutput((sunrealtype)time_00,
                                                                in_stack_ffffffffffffff58,
                                                                (N_Vector)
                                                                CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff50),yB_00);
                                                  printf("\nFinal Statistics:\n");
                                                  uVar4 = CVodeGetAdjCVodeBmem(local_48,local_78);
                                                  CVodePrintAllStats(uVar4,_stdout,0);
                                                  local_50 = fopen(
                                                  "cvsRoberts_ASAi_dns_bkw2_stats.csv","w");
                                                  uVar4 = CVodeGetAdjCVodeBmem(local_48,local_78);
                                                  CVodePrintAllStats(uVar4,local_50,1);
                                                  fclose(local_50);
                                                  CVodeFree(&local_48);
                                                  N_VDestroy(local_68);
                                                  N_VDestroy(local_70);
                                                  N_VDestroy(plVar3);
                                                  N_VDestroy(time_00);
                                                  SUNLinSolFree(local_38);
                                                  SUNMatDestroy(local_28);
                                                  SUNLinSolFree(local_40);
                                                  SUNMatDestroy(local_30);
                                                  SUNContext_Free(local_18);
                                                  if (yB_00 != (N_Vector)0x0) {
                                                    free(yB_00);
                                                  }
                                                  free(local_20);
                                                  local_4 = 0;
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_4 = 1;
                                                  }
                                                }
                                                else {
                                                  local_4 = 1;
                                                }
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;
  void* cvode_mem;
  FILE* FID;

  sunrealtype reltolQ, abstolQ;
  N_Vector y, q;

  int steps;

  int indexB;

  sunrealtype reltolB, abstolB, abstolQB;
  N_Vector yB, qB;

  sunrealtype time;
  int retval, ncheck;

  CVadjCheckPointRec* ckpnt;

  data = NULL;
  A = AB = NULL;
  LS = LSB  = NULL;
  cvode_mem = NULL;
  ckpnt     = NULL;
  y = yB = qB = NULL;

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("-------------------------------------------------\n\n");
  printf("ODE: dy1/dt = -p1*y1 + p2*y2*y3\n");
  printf("     dy2/dt =  p1*y1 - p2*y2*y3 - p3*(y2)^2\n");
  printf("     dy3/dt =  p3*(y2)^2\n\n");
  printf("Find dG/dp for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initialize y */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  Ith(y, 1) = SUN_RCONST(1.0);
  Ith(y, 2) = ZERO;
  Ith(y, 3) = ZERO;

  /* Initialize q */
  q = N_VNew_Serial(1, sunctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Set the scalar realtive and absolute tolerances reltolQ and abstolQ */
  reltolQ = RTOL;
  abstolQ = ATOLq;

  /* Create and allocate CVODES memory for forward run */
  printf("Create and allocate CVODES memory for forward runs\n");

  /* Call CVodeCreate to create the solver memory and specify the
     Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
     user's right hand side function in y'=f(t,y), the initial time T0, and
     the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeWFtolerances to specify a user-supplied function ewt that sets
     the multiplicative error weights w_i for use in the weighted RMS norm */
  retval = CVodeWFtolerances(cvode_mem, ewt);
  if (check_retval(&retval, "CVodeWFtolerances", 1)) { return (1); }

  /* Attach user data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Call CVodeQuadInit to allocate initernal memory and initialize
     quadrature integration*/
  retval = CVodeQuadInit(cvode_mem, fQ, q);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  /* Call CVodeSetQuadErrCon to specify whether or not the quadrature variables
     are to be used in the step size control mechanism within CVODES. Call
     CVodeQuadSStolerances or CVodeQuadSVtolerances to specify the integration
     tolerances for the quadrature variables. */
  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  /* Call CVodeQuadSStolerances to specify scalar relative and absolute
     tolerances. */
  retval = CVodeQuadSStolerances(cvode_mem, reltolQ, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  /* Call CVodeSetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = CVodeSetMaxNumSteps(cvode_mem, 2500);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Allocate global memory */

  /* Call CVodeAdjInit to update CVODES memory block by allocting the internal
     memory needed for backward integration.*/
  steps = STEPS; /* no. of integration steps between two consecutive ckeckpoints*/
  retval = CVodeAdjInit(cvode_mem, steps, CV_HERMITE);
  /*
  retval = CVodeAdjInit(cvode_mem, steps, CV_POLYNOMIAL);
  */
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("Forward integration ... ");

  /* Call CVodeF to integrate the forward problem over an interval in time and
     saves checkpointing data */
  retval = CVodeF(cvode_mem, TOUT, y, &time, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("done (ncheck = %d)\n", ncheck);

  retval = CVodeGetQuad(cvode_mem, &time, q);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %12.4Le \n", Ith(q, 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("G:          %12.4e \n", Ith(q, 1));
#else
  printf("G:          %12.4e \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n");

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(cvode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_fwd_stats.csv", "w");
  retval = CVodePrintAllStats(cvode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Test check point linked list
     (uncomment next block to print check point information) */

  /*
  {
    int i;

    printf("\nList of Check Points (ncheck = %d)\n\n", ncheck);
    ckpnt = (CVadjCheckPointRec *) malloc ( (ncheck+1)*sizeof(CVadjCheckPointRec));
    CVodeGetAdjCheckPointsInfo(cvode_mem, ckpnt);
    for (i=0;i<=ncheck;i++) {
      printf("Address:       %p\n",ckpnt[i].my_addr);
      printf("Next:          %p\n",ckpnt[i].next_addr);
      printf("Time interval: %le  %le\n",ckpnt[i].t0, ckpnt[i].t1);
      printf("Step number:   %ld\n",ckpnt[i].nstep);
      printf("Order:         %d\n",ckpnt[i].order);
      printf("Step size:     %le\n",ckpnt[i].step);
      printf("\n");
    }

  }
  */

  /* Initialize yB */
  yB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ZERO;

  /* Initialize qB */
  qB = N_VNew_Serial(NP, sunctx);
  if (check_retval((void*)qB, "N_VNew", 0)) { return (1); }
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  /* Set the scalar relative tolerance reltolB */
  reltolB = RTOL;

  /* Set the scalar absolute tolerance abstolB */
  abstolB = ATOLl;

  /* Set the scalar absolute tolerance abstolQB */
  abstolQB = ATOLq;

  /* Create and allocate CVODES memory for backward run */
  printf("\nCreate and allocate CVODES memory for backward run\n");

  /* Call CVodeCreateB to specify the solution method for the backward
     problem. */
  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  /* Call CVodeInitB to allocate internal memory and initialize the
     backward problem. */
  retval = CVodeInitB(cvode_mem, indexB, fB, TB1, yB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }

  /* Set the scalar relative and absolute tolerances. */
  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  /* Attach the user data for backward problem. */
  retval = CVodeSetUserDataB(cvode_mem, indexB, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, AB);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine JacB */
  retval = CVodeSetJacFnB(cvode_mem, indexB, JacB);
  if (check_retval(&retval, "CVodeSetJacFnB", 1)) { return (1); }

  /* Call CVodeQuadInitB to allocate internal memory and initialize backward
     quadrature integration. */
  retval = CVodeQuadInitB(cvode_mem, indexB, fQB, qB);
  if (check_retval(&retval, "CVodeQuadInitB", 1)) { return (1); }

  /* Call CVodeSetQuadErrCon to specify whether or not the quadrature variables
     are to be used in the step size control mechanism within CVODES. Call
     CVodeQuadSStolerances or CVodeQuadSVtolerances to specify the integration
     tolerances for the quadrature variables. */
  retval = CVodeSetQuadErrConB(cvode_mem, indexB, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Call CVodeQuadSStolerancesB to specify the scalar relative and absolute tolerances
     for the backward problem. */
  retval = CVodeQuadSStolerancesB(cvode_mem, indexB, reltolB, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  /* Backward Integration */

  PrintHead(TB1);

  /* First get results at t = TBout1 */

  /* Call CVodeB to integrate the backward ODE problem. */
  retval = CVodeB(cvode_mem, TBout1, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  /* Call CVodeGetB to get yB of the backward ODE problem. */
  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  /* Call CVodeGetAdjY to get the interpolated value of the forward solution
     y during a backward integration. */
  retval = CVodeGetAdjY(cvode_mem, TBout1, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput1(time, TBout1, y, yB);

  /* Then at t = T0 */

  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  /* Call CVodeGetQuadB to get the quadrature solution vector after a
     successful return from CVodeB. */
  retval = CVodeGetQuadB(cvode_mem, indexB, &time, qB);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, T0, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput(time, y, yB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), stdout,
                              SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), FID,
                              SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Reinitialize backward phase (new tB0) */

  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ZERO;

  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  printf("\nRe-initialize CVODES memory for backward run\n");

  retval = CVodeReInitB(cvode_mem, indexB, TB2, yB);
  if (check_retval(&retval, "CVodeReInitB", 1)) { return (1); }

  retval = CVodeQuadReInitB(cvode_mem, indexB, qB);
  if (check_retval(&retval, "CVodeQuadReInitB", 1)) { return (1); }

  PrintHead(TB2);

  /* First get results at t = TBout1 */

  retval = CVodeB(cvode_mem, TBout1, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, TBout1, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput1(time, TBout1, y, yB);

  /* Then at t = T0 */

  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB, &time, qB);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, T0, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput(time, y, yB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), stdout,
                              SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_bkw2_stats.csv", "w");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), FID,
                              SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  CVodeFree(&cvode_mem);
  N_VDestroy(y);
  N_VDestroy(q);
  N_VDestroy(yB);
  N_VDestroy(qB);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  SUNContext_Free(&sunctx);

  if (ckpnt != NULL) { free(ckpnt); }
  free(data);

  return (0);
}